

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_local_wall(REF_GRID ref_grid,REF_DICT ref_dict,REF_INT *node_per_ptr,REF_INT *param_4,
                   REF_DBL **param_5)

{
  uint uVar1;
  REF_DBL *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_BOOL RVar5;
  int iVar6;
  REF_CELL *ppRVar7;
  REF_DBL *pRVar8;
  int iVar9;
  ulong uVar10;
  REF_INT RVar11;
  long lVar12;
  REF_CELL pRVar13;
  int iVar14;
  REF_INT bc;
  REF_INT nodes [27];
  REF_INT local_f0;
  uint local_ec;
  ulong local_e8;
  int local_dc;
  REF_DICT local_d8;
  REF_GRID local_d0;
  REF_NODE local_c8;
  uint *local_c0;
  REF_INT *local_b8;
  REF_DBL **local_b0;
  int local_a8 [30];
  
  local_c8 = ref_grid->node;
  ppRVar7 = ref_grid->cell;
  if (ref_grid->twod == 0) {
    ppRVar7 = ref_grid->cell + 3;
  }
  pRVar13 = *ppRVar7;
  uVar1 = pRVar13->node_per;
  local_d8 = ref_dict;
  local_d0 = ref_grid;
  local_c0 = (uint *)node_per_ptr;
  local_b8 = param_4;
  local_b0 = param_5;
  if (pRVar13->max < 1) {
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    RVar11 = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar13,RVar11,local_a8);
      if (RVar3 == 0) {
        local_f0 = -1;
        uVar4 = ref_dict_value(local_d8,local_a8[pRVar13->node_per],&local_f0);
        if ((uVar4 != 0) && (uVar4 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x5f4,"ref_phys_local_wall",(ulong)uVar4,"bc");
          local_ec = uVar4;
        }
        if ((uVar4 != 5) && (uVar4 != 0)) {
          return local_ec;
        }
        RVar5 = ref_phys_wall_distance_bc(local_f0);
        iVar14 = iVar14 + RVar5;
      }
      RVar11 = RVar11 + 1;
    } while (RVar11 < pRVar13->max);
  }
  if (local_d0->twod == 0) {
    pRVar13 = local_d0->cell[6];
    if (0 < pRVar13->max) {
      RVar11 = 0;
      do {
        RVar3 = ref_cell_nodes(pRVar13,RVar11,local_a8);
        iVar9 = iVar14;
        if (RVar3 == 0) {
          local_f0 = -1;
          uVar4 = ref_dict_value(local_d8,local_a8[pRVar13->node_per],&local_f0);
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x5fe,"ref_phys_local_wall",(ulong)uVar4,"bc");
            local_ec = uVar4;
          }
          if ((uVar4 != 5) && (uVar4 != 0)) {
            return local_ec;
          }
          RVar5 = ref_phys_wall_distance_bc(local_f0);
          iVar9 = iVar14 + 2;
          if (RVar5 == 0) {
            iVar9 = iVar14;
          }
        }
        iVar14 = iVar9;
        RVar11 = RVar11 + 1;
      } while (RVar11 < pRVar13->max);
    }
    pRVar13 = local_d0->cell[3];
  }
  local_dc = uVar1 * 3;
  if (iVar14 * local_dc < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x605,
           "ref_phys_local_wall","malloc local_xyz of REF_DBL negative");
    RVar3 = 1;
  }
  else {
    pRVar8 = (REF_DBL *)malloc((ulong)(uint)(iVar14 * local_dc) << 3);
    if (pRVar8 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x605,
             "ref_phys_local_wall","malloc local_xyz of REF_DBL NULL");
      RVar3 = 2;
    }
    else {
      if (pRVar13->max < 1) {
        local_e8 = 0;
      }
      else {
        local_e8 = 0;
        iVar14 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar13,iVar14,local_a8);
          if (RVar3 == 0) {
            local_f0 = -1;
            uVar4 = ref_dict_value(local_d8,local_a8[pRVar13->node_per],&local_f0);
            if ((uVar4 != 0) && (uVar4 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x60a,"ref_phys_local_wall",(ulong)uVar4,"bc");
              local_ec = uVar4;
            }
            if ((uVar4 != 5) && (uVar4 != 0)) {
              return local_ec;
            }
            RVar5 = ref_phys_wall_distance_bc(local_f0);
            if (RVar5 != 0) {
              if (0 < (int)uVar1) {
                pRVar2 = local_c8->real;
                iVar9 = (int)local_e8 * local_dc;
                uVar10 = 0;
                do {
                  iVar6 = local_a8[uVar10];
                  lVar12 = 0;
                  do {
                    pRVar8[iVar9 + (int)lVar12] = pRVar2[(long)iVar6 * 0xf + lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 3);
                  uVar10 = uVar10 + 1;
                  iVar9 = iVar9 + 3;
                } while (uVar10 != uVar1);
              }
              local_e8 = (ulong)((int)local_e8 + 1);
            }
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < pRVar13->max);
      }
      if ((local_d0->twod == 0) && (pRVar13 = local_d0->cell[6], 0 < pRVar13->max)) {
        iVar14 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar13,iVar14,local_a8);
          if (RVar3 == 0) {
            local_f0 = -1;
            uVar4 = ref_dict_value(local_d8,local_a8[pRVar13->node_per],&local_f0);
            if ((uVar4 != 0) && (uVar4 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x61a,"ref_phys_local_wall",(ulong)uVar4,"bc");
              local_ec = uVar4;
            }
            if ((uVar4 != 5) && (uVar4 != 0)) {
              return local_ec;
            }
            RVar5 = ref_phys_wall_distance_bc(local_f0);
            if (RVar5 != 0) {
              pRVar2 = local_c8->real;
              iVar6 = (int)local_e8;
              iVar9 = iVar6 * local_dc;
              lVar12 = 0;
              do {
                pRVar8[iVar9 + lVar12] = pRVar2[(long)local_a8[0] * 0xf + lVar12];
                pRVar8[iVar9 + (int)lVar12 + 3] = pRVar2[(long)local_a8[1] * 0xf + lVar12];
                pRVar8[iVar9 + (int)lVar12 + 6] = pRVar2[(long)local_a8[2] * 0xf + lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              pRVar2 = local_c8->real;
              iVar9 = (iVar6 + 1) * local_dc;
              lVar12 = 0;
              do {
                pRVar8[iVar9 + lVar12] = pRVar2[(long)local_a8[0] * 0xf + lVar12];
                pRVar8[iVar9 + (int)lVar12 + 3] = pRVar2[(long)local_a8[2] * 0xf + lVar12];
                pRVar8[iVar9 + (int)lVar12 + 6] = pRVar2[(long)local_a8[3] * 0xf + lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              local_e8 = (ulong)(iVar6 + 2);
            }
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < pRVar13->max);
      }
      *local_c0 = uVar1;
      *local_b8 = (REF_INT)local_e8;
      *local_b0 = pRVar8;
      RVar3 = 0;
    }
  }
  return RVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_phys_local_wall(REF_GRID ref_grid,
                                              REF_DICT ref_dict,
                                              REF_INT *node_per_ptr,
                                              REF_INT *local_ncell_ptr,
                                              REF_DBL **local_xyz_ptr) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT local_ncell;
  REF_DBL *local_xyz;
  REF_INT node_per;
  REF_CELL ref_cell;
  REF_INT i, node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT bc;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_edg(ref_grid);
  } else {
    ref_cell = ref_grid_tri(ref_grid);
  }
  node_per = ref_cell_node_per(ref_cell);
  local_ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      local_ncell++;
    }
  }
  if (!ref_grid_twod(ref_grid)) { /* adds quads as two tri */
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        local_ncell += 2;
      }
    }
    ref_cell = ref_grid_tri(ref_grid);
  }
  ref_malloc(local_xyz, 3 * node_per * local_ncell, REF_DBL);
  local_ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      for (node = 0; node < node_per; node++) {
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * node + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[node]);
        }
      }
      local_ncell++;
    }
  }
  if (!ref_grid_twod(ref_grid)) { /* adds quads as two tri */
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * 0 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[0]);
          local_xyz[i + 3 * 1 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[1]);
          local_xyz[i + 3 * 2 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[2]);
        }
        local_ncell += 1;
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * 0 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[0]);
          local_xyz[i + 3 * 1 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[2]);
          local_xyz[i + 3 * 2 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[3]);
        }
        local_ncell += 1;
      }
    }
    ref_cell = ref_grid_tri(ref_grid);
  }

  *node_per_ptr = node_per;
  *local_ncell_ptr = local_ncell;
  *local_xyz_ptr = local_xyz;

  return REF_SUCCESS;
}